

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainLoop.h
# Opt level: O2

shared_ptr<MainLoop> MainLoop::Init(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  shared_ptr<MainLoop> sVar1;
  __shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  if (__MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::make_shared<MainLoop>();
    std::__shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&__MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>,&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  }
  std::__shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (in_RDI,&__MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>);
  sVar1.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI;
  return (shared_ptr<MainLoop>)sVar1.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MainLoop> MainLoop::Init()
{
	if (__MainLoop__ == NULL)
	{
		__MainLoop__ = std::make_shared<MainLoop>();
	}
	return __MainLoop__;
}